

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,Pubkey *pubkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  bool bVar1;
  undefined8 uVar2;
  string *message;
  undefined4 in_stack_ffffffffffffff2c;
  CfdError error_code;
  undefined1 local_b1 [33];
  CfdSourceLocation local_90;
  ByteData160 local_68;
  ByteData local_50;
  uint8_t local_31;
  ByteData256 *pBStack_30;
  uint8_t depth_local;
  ByteData256 *chain_code_local;
  Pubkey *pubkey_local;
  Pubkey *parent_key_local;
  ExtPubkey *pEStack_10;
  NetType network_type_local;
  ExtPubkey *this_local;
  
  local_31 = depth;
  pBStack_30 = chain_code;
  chain_code_local = (ByteData256 *)pubkey;
  pubkey_local = parent_key;
  parent_key_local._4_4_ = network_type;
  pEStack_10 = this;
  HashUtil::Hash160(&local_68,parent_key);
  ByteData160::GetData(&local_50,&local_68);
  ExtPubkey(this,network_type,&local_50,(Pubkey *)chain_code_local,pBStack_30,local_31,child_num);
  ByteData::~ByteData((ByteData *)0x447f78);
  ByteData160::~ByteData160((ByteData160 *)0x447f81);
  bVar1 = Pubkey::IsValid(pubkey_local);
  error_code = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
  if (!bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x375;
    local_90.funcname = "ExtPubkey";
    logger::warn<>(&local_90,"invalid pubkey.");
    uVar2 = __cxa_allocate_exception(0x30);
    message = (string *)local_b1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_b1 + 1),"Failed to pubkey. ExtPubkey invalid pubkey.",
               (allocator *)message);
    CfdException::CfdException((CfdException *)this,error_code,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key, const Pubkey& pubkey,
    const ByteData256& chain_code, uint8_t depth, uint32_t child_num)
    : ExtPubkey(
          network_type, HashUtil::Hash160(parent_key).GetData(), pubkey,
          chain_code, depth, child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid pubkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to pubkey. ExtPubkey invalid pubkey.");
  }
}